

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnAssertUninstantiableCommand
          (CommandRunner *this,AssertUninstantiableCommand *command)

{
  string_view module_filename;
  Ref module_00;
  Enum EVar1;
  bool bVar2;
  Ptr module;
  Ptr trap;
  RefVec imports;
  Errors errors;
  Ptr instance;
  
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  module_filename.data_ = (command->filename)._M_dataplus._M_p;
  module_filename.size_ = (command->filename)._M_string_length;
  ReadModule(&module,this,module_filename,&errors);
  if (module.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
               "unable to compile uninstantiable module: \"%s\"",
               (command->filename)._M_dataplus._M_p);
    EVar1 = Error;
  }
  else {
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopulateImports(this,&module,&imports);
    trap.obj_ = (Trap *)0x0;
    trap.store_ = (Store *)0x0;
    trap.root_index_ = 0;
    module_00 = wabt::interp::RefPtr<wabt::interp::Module>::ref(&module);
    wabt::interp::Instance::Instantiate(&instance,&this->store_,module_00,&imports,&trap);
    bVar2 = trap.obj_ == (Trap *)0x0;
    if (bVar2) {
      PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
                 "expected module to be uninstantiable: \"%s\"",(command->filename)._M_dataplus._M_p
                );
    }
    EVar1 = (Enum)bVar2;
    wabt::interp::RefPtr<wabt::interp::Instance>::reset(&instance);
    wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
    std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
              (&imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>);
  }
  wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  return (Result)EVar1;
}

Assistant:

wabt::Result CommandRunner::OnAssertUninstantiableCommand(
    const AssertUninstantiableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile uninstantiable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be uninstantiable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: print error when assertion passes.
#if 0
  PrintError(command->line, "assert_uninstantiable passed: %s",
             trap->message().c_str());
#endif
  return wabt::Result::Ok;
}